

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

TCGv_i64 clean_data_tbi(DisasContext_conflict1 *s,TCGv_i64 addr)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  pTVar1 = new_tmp_a64_aarch64(s);
  if (pTVar1 != addr) {
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(pTVar1 + (long)tcg_ctx),
                        (TCGArg)(addr + (long)tcg_ctx));
  }
  return pTVar1;
}

Assistant:

static TCGv_i64 clean_data_tbi(DisasContext *s, TCGv_i64 addr)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 clean = new_tmp_a64(s);
    /*
     * In order to get the correct value in the FAR_ELx register,
     * we must present the memory subsystem with the "dirty" address
     * including the TBI.  In system mode we can make this work via
     * the TLB, dropping the TBI during translation.  But for user-only
     * mode we don't have that option, and must remove the top byte now.
     */
    tcg_gen_mov_i64(tcg_ctx, clean, addr);
    return clean;
}